

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

UniValue * __thiscall
ExternalSigner::GetDescriptors(UniValue *__return_storage_ptr__,ExternalSigner *this,int account)

{
  long in_FS_OFFSET;
  allocator<char> local_125;
  int local_124;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_124 = account;
  std::operator+(&local_c0,&this->m_command," --fingerprint ");
  std::operator+(&local_a0,&local_c0,&this->m_fingerprint);
  NetworkArg_abi_cxx11_(&local_e0,this);
  std::operator+(&local_80,&local_a0,&local_e0);
  std::operator+(&local_60,&local_80," getdescriptors --account ");
  tinyformat::format<int>(&local_100,"%d",&local_124);
  std::operator+(&local_40,&local_60,&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_125);
  RunCommandParseJSON(__return_storage_ptr__,&local_40,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ExternalSigner::GetDescriptors(const int account)
{
    return RunCommandParseJSON(m_command + " --fingerprint " + m_fingerprint + NetworkArg() + " getdescriptors --account " + strprintf("%d", account));
}